

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

void psh_glyph_load_points(PSH_Glyph glyph,FT_Int dimension)

{
  FT_Pos FVar1;
  FT_Vector *pFVar2;
  FT_Vector *pFVar3;
  FT_Pos *pFVar4;
  FT_UInt FVar5;
  FT_Vector *pFVar6;
  bool bVar7;
  
  pFVar3 = glyph->outline->points;
  FVar5 = glyph->num_points;
  pFVar4 = &glyph->points->org_v;
  while (bVar7 = FVar5 != 0, FVar5 = FVar5 - 1, bVar7) {
    *(FT_UInt *)((long)pFVar4 + -0x1c) = 0;
    pFVar4[-2] = 0;
    pFVar6 = (FT_Vector *)&pFVar3->y;
    pFVar2 = pFVar3;
    if (dimension != 0) {
      pFVar6 = pFVar3;
      pFVar2 = (FT_Vector *)&pFVar3->y;
    }
    FVar1 = pFVar6->x;
    pFVar4[-1] = pFVar2->x;
    *pFVar4 = FVar1;
    pFVar4 = pFVar4 + 9;
    pFVar3 = pFVar3 + 1;
  }
  return;
}

Assistant:

static void
  psh_glyph_load_points( PSH_Glyph  glyph,
                         FT_Int     dimension )
  {
    FT_Vector*  vec   = glyph->outline->points;
    PSH_Point   point = glyph->points;
    FT_UInt     count = glyph->num_points;


    for ( ; count > 0; count--, point++, vec++ )
    {
      point->flags2 = 0;
      point->hint   = NULL;
      if ( dimension == 0 )
      {
        point->org_u = vec->x;
        point->org_v = vec->y;
      }
      else
      {
        point->org_u = vec->y;
        point->org_v = vec->x;
      }

#ifdef DEBUG_HINTER
      point->org_x = vec->x;
      point->org_y = vec->y;
#endif

    }
  }